

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

void Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::intersection<false>
               (vector<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>,_std::allocator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>_>
                *intersection,Dictionary_const_it *begin1,Dictionary_const_it *end1,
               Dictionary_const_it *begin2,Dictionary_const_it *end2,Filtration_value *filtration_)

{
  int iVar1;
  Dictionary_const_it *this;
  bool bVar2;
  pointer ppVar3;
  Filtration_value *pFVar4;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  *pvVar5;
  Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
  local_58;
  Filtration_value local_40;
  Filtration_value filt;
  Filtration_value *filtration__local;
  Dictionary_const_it *end2_local;
  Dictionary_const_it *begin2_local;
  Dictionary_const_it *end1_local;
  Dictionary_const_it *begin1_local;
  vector<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>,_std::allocator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>_>
  *intersection_local;
  
  filt = (Filtration_value)filtration_;
  filtration__local = (Filtration_value *)end2;
  end2_local = begin2;
  begin2_local = end1;
  end1_local = begin1;
  begin1_local = (Dictionary_const_it *)intersection;
  bVar2 = boost::container::operator==(begin1,end1);
  if (!bVar2) {
    bVar2 = boost::container::operator==(begin2,end2);
    while (!bVar2) {
      while( true ) {
        while( true ) {
          ppVar3 = boost::container::
                   vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                   ::operator->(begin1);
          iVar1 = ppVar3->first;
          ppVar3 = boost::container::
                   vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                   ::operator->(begin2);
          if (iVar1 != ppVar3->first) break;
          ppVar3 = boost::container::
                   vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                   ::operator->(begin1);
          pFVar4 = Filtration_simplex_base_real::filtration
                             (&(ppVar3->second).super_Filtration_simplex_base);
          local_40 = *pFVar4;
          ppVar3 = boost::container::
                   vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                   ::operator->(begin2);
          pFVar4 = Filtration_simplex_base_real::filtration
                             (&(ppVar3->second).super_Filtration_simplex_base);
          intersect_lifetimes<double>(&local_40,pFVar4);
          intersect_lifetimes<double>(&local_40,(double *)filt);
          this = begin1_local;
          ppVar3 = boost::container::
                   vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                   ::operator->(begin1);
          Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
          ::Simplex_tree_node_explicit_storage(&local_58,(Siblings *)0x0,&local_40);
          std::
          vector<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>,std::allocator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>>>
          ::
          emplace_back<int_const&,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>
                    ((vector<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>,std::allocator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>>>
                      *)this,&ppVar3->first,&local_58);
          pvVar5 = boost::container::
                   vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                   ::operator++(begin1);
          bVar2 = boost::container::operator==(pvVar5,end1);
          if (bVar2) {
            return;
          }
          pvVar5 = boost::container::
                   vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                   ::operator++(begin2);
          bVar2 = boost::container::operator==(pvVar5,end2);
          if (bVar2) {
            return;
          }
        }
        ppVar3 = boost::container::
                 vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                 ::operator->(begin1);
        iVar1 = ppVar3->first;
        ppVar3 = boost::container::
                 vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                 ::operator->(begin2);
        if (ppVar3->first <= iVar1) break;
        pvVar5 = boost::container::
                 vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                 ::operator++(begin1);
        bVar2 = boost::container::operator==(pvVar5,end1);
        if (bVar2) {
          return;
        }
      }
      pvVar5 = boost::container::
               vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
               ::operator++(begin2);
      bVar2 = boost::container::operator==(pvVar5,end2);
    }
  }
  return;
}

Assistant:

static void intersection(std::vector<std::pair<Vertex_handle, Node> >& intersection,
                           Dictionary_const_it begin1, Dictionary_const_it end1,
                           Dictionary_const_it begin2, Dictionary_const_it end2,
                           const Filtration_value& filtration_) {
    if (begin1 == end1 || begin2 == end2)
      return;  // ----->>
    while (true) {
      if (begin1->first == begin2->first) {
        if constexpr (force_filtration_value){
          intersection.emplace_back(begin1->first, Node(nullptr, filtration_));
        } else {
          Filtration_value filt = begin1->second.filtration();
          intersect_lifetimes(filt, begin2->second.filtration());
          intersect_lifetimes(filt, filtration_);
          intersection.emplace_back(begin1->first, Node(nullptr, filt));
        }
        if (++begin1 == end1 || ++begin2 == end2)
          return;  // ----->>
      } else if (begin1->first < begin2->first) {
        if (++begin1 == end1)
          return;
      } else /* begin1->first > begin2->first */ {
        if (++begin2 == end2)
          return;  // ----->>
      }
    }
  }